

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O3

void bssl::anon_unknown_17::PathBuilderPkitsTestDelegate::RunTest
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *cert_ders,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *crl_ders,PkitsTestInfo *orig_info)

{
  pointer pbVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  CertPathBuilderResultPath *pCVar9;
  uint uVar10;
  pointer *__ptr;
  pointer pbVar11;
  char *pcVar12;
  char *in_R9;
  long lVar13;
  size_type __rlen;
  ulong uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_320;
  undefined1 local_318 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  Message local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e8;
  CrlCheckingPathBuilderDelegate path_builder_delegate;
  Result result;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_270;
  shared_ptr<const_bssl::ParsedCertificate> local_268;
  shared_ptr<const_bssl::ParsedCertificate> local_258;
  ParsedCertificateList certs;
  int64_t verify_time;
  CertIssuerSourceStatic cert_issuer_source;
  shared_ptr<const_bssl::ParsedCertificate> local_1d0;
  CertPathBuilder path_builder;
  TrustStoreInMemory trust_store;
  PkitsTestInfo info;
  
  PkitsTestInfo::PkitsTestInfo(&info,orig_info);
  pbVar11 = (cert_ders->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cert_ders->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  trust_store.super_TrustStore.super_CertIssuerSource._vptr_CertIssuerSource._0_1_ =
       pbVar11 != pbVar1;
  trust_store.entries_._M_h._M_buckets = (__buckets_ptr)0x0;
  if (pbVar11 == pbVar1) {
    testing::Message::Message((Message *)&cert_issuer_source);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&path_builder,(internal *)&trust_store,
               (AssertionResult *)"cert_ders.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&path_builder_delegate,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
               ,0x95,(char *)CONCAT71(path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&path_builder_delegate,(Message *)&cert_issuer_source);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&path_builder_delegate);
    if ((pointer *)
        CONCAT71(path_builder.out_result_.paths.
                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                 path_builder.out_result_.paths.
                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_1_) !=
        &path_builder.out_result_.paths.
         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete((undefined1 *)
                      CONCAT71(path_builder.out_result_.paths.
                               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               path_builder.out_result_.paths.
                               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_),
                      (ulong)((long)&((path_builder.out_result_.paths.
                                       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                     .
                                     super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>
                                     ._M_head_impl + 1));
    }
    if (cert_issuer_source.super_CertIssuerSource._vptr_CertIssuerSource != (_func_int **)0x0) {
      (**(code **)(*cert_issuer_source.super_CertIssuerSource._vptr_CertIssuerSource + 8))();
    }
    if (trust_store.entries_._M_h._M_buckets != (__buckets_ptr)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&trust_store.entries_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   trust_store.entries_._M_h._M_buckets);
    }
    goto LAB_002a56da;
  }
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    CertErrors::CertErrors((CertErrors *)&cert_issuer_source);
    local_270._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
         CRYPTO_BUFFER_new((uint8_t *)(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length,
                           (CRYPTO_BUFFER_POOL *)0x0);
    path_builder.out_result_.paths.
    super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    bVar4 = ParsedCertificate::CreateAndAddToVector
                      ((UniquePtr<CRYPTO_BUFFER> *)&local_270,
                       (ParseCertificateOptions *)&path_builder,&certs,
                       (CertErrors *)&cert_issuer_source);
    path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
    super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate._0_1_ = bVar4;
    path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ = 0;
    ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_270);
    if ((char)path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
              super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate == '\0') {
      testing::Message::Message((Message *)&result);
      CertErrors::ToDebugString_abi_cxx11_
                ((string *)&path_builder,(CertErrors *)&cert_issuer_source);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (result.paths.
                  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2),
                 (char *)CONCAT71(path_builder.out_result_.paths.
                                  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  path_builder.out_result_.paths.
                                  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                 (long)path_builder.out_result_.paths.
                       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&trust_store,(internal *)&path_builder_delegate,
                 (AssertionResult *)
                 "ParsedCertificate::CreateAndAddToVector( bssl::UniquePtr<CRYPTO_BUFFER>( CRYPTO_BUFFER_new(reinterpret_cast<const uint8_t *>(der.data()), der.size(), nullptr)), {}, &certs, &errors)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_318,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                 ,0x9d,(char *)CONCAT71(trust_store.super_TrustStore.super_CertIssuerSource.
                                        _vptr_CertIssuerSource._1_7_,
                                        trust_store.super_TrustStore.super_CertIssuerSource.
                                        _vptr_CertIssuerSource._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
      if ((size_type *)
          CONCAT71(trust_store.super_TrustStore.super_CertIssuerSource._vptr_CertIssuerSource._1_7_,
                   trust_store.super_TrustStore.super_CertIssuerSource._vptr_CertIssuerSource._0_1_)
          != &trust_store.entries_._M_h._M_bucket_count) {
        operator_delete((undefined1 *)
                        CONCAT71(trust_store.super_TrustStore.super_CertIssuerSource.
                                 _vptr_CertIssuerSource._1_7_,
                                 trust_store.super_TrustStore.super_CertIssuerSource.
                                 _vptr_CertIssuerSource._0_1_),
                        trust_store.entries_._M_h._M_bucket_count + 1);
      }
      if ((pointer *)
          CONCAT71(path_builder.out_result_.paths.
                   super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                   path_builder.out_result_.paths.
                   super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_1_) !=
          &path_builder.out_result_.paths.
           super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete((undefined1 *)
                        CONCAT71(path_builder.out_result_.paths.
                                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 path_builder.out_result_.paths.
                                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_),
                        (ulong)((long)&((path_builder.out_result_.paths.
                                         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                       .
                                       super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>
                                       ._M_head_impl + 1));
      }
      if (result.paths.
          super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)*(pointer *)
                   ((long)&((((result.paths.
                               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                            _M_head_impl)->certs).
                           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   + 8))();
      }
      if (path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&path_builder_delegate.super_SimplePathBuilderDelegate.
                         min_rsa_modulus_length_bits_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     path_builder_delegate.super_SimplePathBuilderDelegate.
                     min_rsa_modulus_length_bits_);
      }
      CertErrors::~CertErrors((CertErrors *)&cert_issuer_source);
      goto LAB_002a56cd;
    }
    if (path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ != 0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&path_builder_delegate.super_SimplePathBuilderDelegate.
                       min_rsa_modulus_length_bits_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path_builder_delegate.super_SimplePathBuilderDelegate.
                   min_rsa_modulus_length_bits_);
    }
    CertErrors::~CertErrors((CertErrors *)&cert_issuer_source);
    pbVar11 = pbVar11 + 1;
  } while (pbVar11 != pbVar1);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store);
  local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((certs.
         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       ((certs.
         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TrustStoreInMemory::AddTrustAnchor(&trust_store,&local_258);
  if (local_258.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CertIssuerSourceStatic::CertIssuerSourceStatic(&cert_issuer_source);
  if (((long)(cert_ders->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(cert_ders->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 5) - 3U < 0xfffffffffffffffe) {
    uVar14 = 1;
    lVar13 = 0x18;
    do {
      local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(element_type **)
              ((long)certs.
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
      local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&((certs.
                      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr + lVar13);
      if (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_268.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_268.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      CertIssuerSourceStatic::AddCert(&cert_issuer_source,&local_268);
      if (local_268.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < ((long)(cert_ders->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(cert_ders->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
  }
  peVar2 = certs.
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this = certs.
         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  bVar4 = bssl::der::GeneralizedTimeToPosixTime(&info.time,&verify_time);
  path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
  super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate._0_1_ = bVar4;
  path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ = 0;
  if (bVar4) {
    SimplePathBuilderDelegate::SimplePathBuilderDelegate
              (&path_builder_delegate.super_SimplePathBuilderDelegate,0x400,kMaxValue);
    path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
    super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate =
         (VerifyCertificateChainDelegate)&PTR_IsSignatureAlgorithmAcceptable_006b48a8;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&path_builder_delegate.der_crls_,crl_ders);
    path_builder_delegate.verify_time_ = verify_time;
    path_builder_delegate.max_age_ = 0x3c26700;
    sVar8 = strlen(info.test_number);
    if (sVar8 == 5) {
      iVar6 = bcmp(info.test_number,"4.5.3",5);
      if ((iVar6 != 0) && (info.test_number[4] != '4' || *(int *)info.test_number != 0x2e352e34)) {
        uVar7 = *(uint *)info.test_number ^ 0x2e352e34;
        uVar10 = (byte)info.test_number[4] ^ 0x36;
LAB_002a52bf:
        if (uVar10 != 0 || uVar7 != 0) goto LAB_002a52cc;
      }
LAB_002a52c3:
      info.should_validate = false;
    }
    else {
      if (sVar8 == 7) {
        iVar6 = bcmp(info.test_number,"4.14.18",7);
        if ((((iVar6 != 0) &&
             (*(int *)(info.test_number + 3) != 0x39312e34 || *(int *)info.test_number != 0x34312e34
             )) && (*(int *)(info.test_number + 3) != 0x32322e34 ||
                    *(int *)info.test_number != 0x34312e34)) &&
           (((*(int *)(info.test_number + 3) != 0x34322e34 || *(int *)info.test_number != 0x34312e34
             && (*(int *)(info.test_number + 3) != 0x35322e34 ||
                 *(int *)info.test_number != 0x34312e34)) &&
            ((*(int *)(info.test_number + 3) != 0x38322e34 || *(int *)info.test_number != 0x34312e34
             && ((*(int *)(info.test_number + 3) != 0x39322e34 ||
                  *(int *)info.test_number != 0x34312e34 &&
                 (*(int *)(info.test_number + 3) != 0x30332e34 ||
                  *(int *)info.test_number != 0x34312e34)))))))) {
          uVar7 = *(uint *)info.test_number ^ 0x34312e34;
          uVar10 = *(uint *)(info.test_number + 3) ^ 0x33332e34;
          goto LAB_002a52bf;
        }
        goto LAB_002a52c3;
      }
      if (sVar8 == 6) {
        if (((((*(short *)(info.test_number + 4) == 0x3931 && *(int *)info.test_number == 0x2e342e34
               ) || (iVar6 = bcmp(info.test_number,"4.14.1",6), iVar6 == 0)) ||
             (*(short *)(info.test_number + 4) == 0x342e && *(int *)info.test_number == 0x34312e34))
            || ((*(short *)(info.test_number + 4) == 0x352e &&
                 *(int *)info.test_number == 0x34312e34 ||
                (*(short *)(info.test_number + 4) == 0x372e &&
                 *(int *)info.test_number == 0x34312e34)))) ||
           ((iVar6 = bcmp(info.test_number,"4.15.1",6), iVar6 == 0 ||
            (*(short *)(info.test_number + 4) == 0x352e && *(int *)info.test_number == 0x35312e34)))
           ) goto LAB_002a52c3;
        if (*(short *)(info.test_number + 4) == 0x342e && *(int *)info.test_number == 0x35312e34) {
          info.should_validate = true;
        }
      }
    }
LAB_002a52cc:
    local_1d0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    local_1d0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this;
    CertPathBuilder::CertPathBuilder
              (&path_builder,&local_1d0,&trust_store.super_TrustStore,
               (CertPathBuilderDelegate *)&path_builder_delegate,&info.time,ANY_EKU,
               info.initial_explicit_policy,&info.initial_policy_set,
               info.initial_policy_mapping_inhibit,info.initial_inhibit_any_policy);
    if (local_1d0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.
                 super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    CertPathBuilder::AddCertIssuerSource(&path_builder,&cert_issuer_source.super_CertIssuerSource);
    CertPathBuilder::Run(&result,&path_builder);
    bVar4 = info.should_validate;
    bVar5 = CertPathBuilder::Result::HasValidPath(&result);
    if (bVar4 == bVar5) {
LAB_002a54d3:
      bVar4 = CertPathBuilder::Result::HasValidPath(&result);
      if (bVar4) {
        pCVar9 = CertPathBuilder::Result::GetBestValidPath(&result);
        testing::internal::
        CmpHelperEQ<std::set<bssl::der::Input,std::less<bssl::der::Input>,std::allocator<bssl::der::Input>>,std::set<bssl::der::Input,std::less<bssl::der::Input>,std::allocator<bssl::der::Input>>>
                  ((internal *)local_318,"info.user_constrained_policy_set",
                   "result.GetBestValidPath()->user_constrained_policy_set",
                   &info.user_constrained_policy_set,&pCVar9->user_constrained_policy_set);
        if (local_318[0] == (internal)0x0) {
          testing::Message::Message(&local_2f8);
          if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar12 = "";
          }
          else {
            pcVar12 = (local_310->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                     ,0x102,pcVar12);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,&local_2f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
          if ((long *)CONCAT71(local_2f8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._1_7_,
                               local_2f8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_2f8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._1_7_,
                                           local_2f8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._0_1_) + 8))();
          }
        }
        if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_310,local_310);
        }
      }
    }
    else {
      testing::Message::Message((Message *)&local_320);
      if (result.paths.
          super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          result.paths.
          super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar14 = 0;
        do {
          pCVar9 = result.paths.
                   super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                   super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_320._M_head_impl + 0x10),"path ",5);
          ::std::ostream::_M_insert<unsigned_long>((ulong)(local_320._M_head_impl + 0x10));
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_320._M_head_impl + 0x10)," errors:\n",9);
          CertPathErrors::ToDebugString_abi_cxx11_
                    ((string *)local_318,&pCVar9->errors,&pCVar9->certs);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_320._M_head_impl + 0x10),
                     (char *)CONCAT71(local_318._1_7_,local_318[0]),(long)local_310);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_320._M_head_impl + 0x10),"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_318._1_7_,local_318[0]),
                            local_308._M_allocated_capacity + 1);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)result.paths.
                                        super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)result.paths.
                                        super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      local_318[0] = (internal)CertPathBuilder::Result::HasValidPath(&result);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&local_2f8,"info.should_validate","result.HasValidPath()",
                 &info.should_validate,(bool *)local_318);
      if (local_2f8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ != (internal)0x0) {
        if (local_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f0,local_2f0);
        }
        if (local_320._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_320._M_head_impl + 8))();
        }
        goto LAB_002a54d3;
      }
      testing::Message::Message((Message *)&local_2e8);
      _Var3._M_head_impl = local_2e8._M_head_impl;
      testing::Message::GetString_abi_cxx11_((string *)local_318,(Message *)&local_320);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(_Var3._M_head_impl + 0x10),
                 (char *)CONCAT71(local_318._1_7_,local_318[0]),(long)local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_318._1_7_,local_318[0]),
                        local_308._M_allocated_capacity + 1);
      }
      if (local_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (local_2f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_318,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                 ,0xfd,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
      if (local_2e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
      }
      if (local_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f0,local_2f0);
      }
      if (local_320._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_320._M_head_impl + 8))();
      }
    }
    CertPathBuilder::Result::~Result(&result);
    CertPathBuilder::~CertPathBuilder(&path_builder);
    path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
    super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate =
         (VerifyCertificateChainDelegate)&PTR_IsSignatureAlgorithmAcceptable_006b48a8;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&path_builder_delegate.der_crls_);
    VerifyCertificateChainDelegate::~VerifyCertificateChainDelegate
              ((VerifyCertificateChainDelegate *)&path_builder_delegate);
  }
  else {
    testing::Message::Message((Message *)&result);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&path_builder,(internal *)&path_builder_delegate,
               (AssertionResult *)"der::GeneralizedTimeToPosixTime(info.time, &verify_time)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
               ,0xaf,(char *)CONCAT71(path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if ((pointer *)
        CONCAT71(path_builder.out_result_.paths.
                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                 path_builder.out_result_.paths.
                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_1_) !=
        &path_builder.out_result_.paths.
         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete((undefined1 *)
                      CONCAT71(path_builder.out_result_.paths.
                               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               path_builder.out_result_.paths.
                               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_),
                      (ulong)((long)&((path_builder.out_result_.paths.
                                       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                     .
                                     super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>
                                     ._M_head_impl + 1));
    }
    if (result.paths.
        super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)*(pointer *)
                 ((long)&((((result.paths.
                             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                           .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                          _M_head_impl)->certs).
                         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 8))();
    }
    if (path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ != 0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&path_builder_delegate.super_SimplePathBuilderDelegate.
                       min_rsa_modulus_length_bits_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path_builder_delegate.super_SimplePathBuilderDelegate.
                   min_rsa_modulus_length_bits_);
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&cert_issuer_source);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store);
LAB_002a56cd:
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector(&certs);
LAB_002a56da:
  PkitsTestInfo::~PkitsTestInfo(&info);
  return;
}

Assistant:

static void RunTest(std::vector<std::string> cert_ders,
                      std::vector<std::string> crl_ders,
                      const PkitsTestInfo &orig_info) {
    PkitsTestInfo info = orig_info;

    ASSERT_FALSE(cert_ders.empty());
    ParsedCertificateList certs;
    for (const std::string &der : cert_ders) {
      CertErrors errors;
      ASSERT_TRUE(ParsedCertificate::CreateAndAddToVector(
          bssl::UniquePtr<CRYPTO_BUFFER>(
              CRYPTO_BUFFER_new(reinterpret_cast<const uint8_t *>(der.data()),
                                der.size(), nullptr)),
          {}, &certs, &errors))
          << errors.ToDebugString();
    }
    // First entry in the PKITS chain is the trust anchor.
    // TODO(mattm): test with all possible trust anchors in the trust store?
    TrustStoreInMemory trust_store;

    trust_store.AddTrustAnchor(certs[0]);

    // TODO(mattm): test with other irrelevant certs in cert_issuer_sources?
    CertIssuerSourceStatic cert_issuer_source;
    for (size_t i = 1; i < cert_ders.size() - 1; ++i) {
      cert_issuer_source.AddCert(certs[i]);
    }

    std::shared_ptr<const ParsedCertificate> target_cert(certs.back());

    int64_t verify_time;
    ASSERT_TRUE(der::GeneralizedTimeToPosixTime(info.time, &verify_time));
    CrlCheckingPathBuilderDelegate path_builder_delegate(
        crl_ders, verify_time, /*max_age=*/kOneYear * 2, 1024,
        SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

    std::string_view test_number = info.test_number;
    if (test_number == "4.4.19" || test_number == "4.5.3" ||
        test_number == "4.5.4" || test_number == "4.5.6") {
      // 4.4.19 - fails since CRL is signed by a certificate that is not part
      //          of the verified chain, which is not supported.
      // 4.5.3 - fails since non-URI distribution point names are not supported
      // 4.5.4, 4.5.6 - fails since CRL is signed by a certificate that is not
      //                part of verified chain, and also non-URI distribution
      //                point names not supported
      info.should_validate = false;
    } else if (test_number == "4.14.1" || test_number == "4.14.4" ||
               test_number == "4.14.5" || test_number == "4.14.7" ||
               test_number == "4.14.18" || test_number == "4.14.19" ||
               test_number == "4.14.22" || test_number == "4.14.24" ||
               test_number == "4.14.25" || test_number == "4.14.28" ||
               test_number == "4.14.29" || test_number == "4.14.30" ||
               test_number == "4.14.33") {
      // 4.14 tests:
      // .1 - fails since non-URI distribution point names not supported
      // .2, .3 - fails since non-URI distribution point names not supported
      //          (but test is expected to fail for other reason)
      // .4, .5 - fails since non-URI distribution point names not supported,
      //          also uses nameRelativeToCRLIssuer which is not supported
      // .6 - fails since non-URI distribution point names not supported, also
      //      uses nameRelativeToCRLIssuer which is not supported (but test is
      //      expected to fail for other reason)
      // .7 - fails since relative distributionPointName not supported
      // .8, .9 - fails since relative distributionPointName not supported (but
      //          test is expected to fail for other reason)
      // .10, .11, .12, .13, .14, .27, .35 - PASS
      // .15, .16, .17, .20, .21 - fails since onlySomeReasons is not supported
      //                           (but test is expected to fail for other
      //                           reason)
      // .18, .19 - fails since onlySomeReasons is not supported
      // .22, .24, .25, .28, .29, .30, .33 - fails since indirect CRLs are not
      //                                     supported
      // .23, .26, .31, .32, .34 - fails since indirect CRLs are not supported
      //                           (but test is expected to fail for other
      //                           reason)
      info.should_validate = false;
    } else if (test_number == "4.15.1" || test_number == "4.15.5") {
      // 4.15 tests:
      // .1 - fails due to unhandled critical deltaCRLIndicator extension
      // .2, .3, .6, .7, .8, .9, .10 - PASS since expected cert status is
      //                               reflected in base CRL and delta CRL is
      //                               ignored
      // .5 - fails, cert status is "on hold" in base CRL but the delta CRL
      //      which removes the cert from CRL is ignored
      info.should_validate = false;
    } else if (test_number == "4.15.4") {
      // 4.15.4 - Invalid delta-CRL Test4 has the target cert marked revoked in
      // a delta-CRL. Since delta-CRLs are not supported, the chain validates
      // successfully.
      info.should_validate = true;
    }

    CertPathBuilder path_builder(
        std::move(target_cert), &trust_store, &path_builder_delegate, info.time,
        KeyPurpose::ANY_EKU, info.initial_explicit_policy,
        info.initial_policy_set, info.initial_policy_mapping_inhibit,
        info.initial_inhibit_any_policy);
    path_builder.AddCertIssuerSource(&cert_issuer_source);

    CertPathBuilder::Result result = path_builder.Run();

    if (info.should_validate != result.HasValidPath()) {
      testing::Message msg;
      for (size_t i = 0; i < result.paths.size(); ++i) {
        const bssl::CertPathBuilderResultPath *result_path =
            result.paths[i].get();
        msg << "path " << i << " errors:\n"
            << result_path->errors.ToDebugString(result_path->certs) << "\n";
      }
      ASSERT_EQ(info.should_validate, result.HasValidPath()) << msg;
    }

    if (result.HasValidPath()) {
      EXPECT_EQ(info.user_constrained_policy_set,
                result.GetBestValidPath()->user_constrained_policy_set);
    }
  }